

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

word Nf_MatchRefArea(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,int Required)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  word wVar4;
  long lVar5;
  long lVar6;
  
  (p->vBackup).nSize = 0;
  wVar4 = Nf_MatchRef_rec(p,i,c,pM,Required,&p->vBackup);
  if (0 < (p->vBackup).nSize) {
    piVar2 = (p->vBackup).pArray;
    lVar5 = 0;
    do {
      iVar1 = piVar2[lVar5];
      lVar6 = (long)iVar1;
      if (lVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if ((p->vMapRefs).nSize <= iVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = (p->vMapRefs).pArray;
      iVar1 = piVar3[lVar6];
      if (iVar1 < 1) {
        __assert_fail("Nf_ObjMapRefNum(p, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit)) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x6da,"word Nf_MatchRefArea(Nf_Man_t *, int, int, Nf_Mat_t *, int)");
      }
      piVar3[lVar6] = iVar1 + -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vBackup).nSize);
  }
  return wVar4;
}

Assistant:

word Nf_MatchRefArea( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, int Required )
{
    word Area;  int iLit, k; 
    Vec_IntClear( &p->vBackup );
    Area = Nf_MatchRef_rec( p, i, c, pM, Required, &p->vBackup );
    Vec_IntForEachEntry( &p->vBackup, iLit, k )
    {
        assert( Nf_ObjMapRefNum(p, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit)) > 0 );
        Nf_ObjMapRefDec( p, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
    }
    return Area;
}